

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookbehind_matcher.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::
lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::lookbehind_matcher
          (lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *this,shared_matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *xpr,size_t wid,bool no,bool pure)

{
  matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar1;
  undefined **local_50 [2];
  undefined **local_40;
  refcount_ptr<boost::exception_detail::error_info_container> local_38;
  char *pcStack_30;
  char *local_28;
  undefined8 local_20;
  error_type local_18;
  
  pmVar1 = (xpr->xpr_).px;
  (this->xpr_).xpr_.px = pmVar1;
  if (pmVar1 != (matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    LOCK();
    (pmVar1->
    super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ).count_.value_ =
         (pmVar1->
         super_counted_base<boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ).count_.value_ + 1;
    UNLOCK();
  }
  this->not_ = no;
  this->pure_ = pure;
  this->width_ = wid;
  if (wid != 0x3ffffffe) {
    return;
  }
  std::runtime_error::runtime_error
            ((runtime_error *)local_50,"Variable-width look-behind assertions are not supported");
  local_38.px_ = (error_info_container *)0x0;
  local_50[0] = &PTR__regex_error_00195328;
  local_40 = &PTR__regex_error_00195350;
  local_18 = error_badlookbehind;
  pcStack_30 = 
  "boost::xpressive::detail::lookbehind_matcher<boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>>::lookbehind_matcher(const Xpr &, std::size_t, bool, bool) [Xpr = boost::xpressive::detail::shared_matchable<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>]"
  ;
  local_28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/detail/core/matcher/lookbehind_matcher.hpp"
  ;
  local_20._0_4_ = 0x2b;
  local_20._4_4_ = -1;
  throw_exception<boost::xpressive::regex_error>((regex_error *)local_50);
}

Assistant:

lookbehind_matcher(Xpr const &xpr, std::size_t wid, bool no, bool pure = Xpr::pure)
          : xpr_(xpr)
          , not_(no)
          , pure_(pure)
          , width_(wid)
        {
            BOOST_XPR_ENSURE_(!is_unknown(this->width_), regex_constants::error_badlookbehind,
                "Variable-width look-behind assertions are not supported");
        }